

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pe_crypto.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::rc4_handler::set_outgoing_key(rc4_handler *this,span<const_char> key)

{
  uchar *in;
  size_t len;
  undefined1 local_460 [24];
  span<libtorrent::span<char>_> local_448;
  undefined1 local_438 [8];
  span<char> vec;
  char buf [1024];
  rc4_handler *this_local;
  span<const_char> key_local;
  
  key_local.m_ptr = (char *)key.m_len;
  this_local = (rc4_handler *)key.m_ptr;
  this->m_encrypt = true;
  in = (uchar *)span<const_char>::data((span<const_char> *)&this_local);
  len = span<const_char>::size((span<const_char> *)&this_local);
  rc4_init(in,len,&this->m_rc4_outgoing);
  span<char>::span((span<char> *)local_438,(char *)&vec.m_len,0x400);
  span<libtorrent::span<char>_>::span(&local_448,(span<char> *)local_438);
  (*(this->super_crypto_plugin)._vptr_crypto_plugin[4])
            (local_460,this,local_448.m_ptr,local_448.m_len);
  return;
}

Assistant:

void rc4_handler::set_outgoing_key(span<char const> key)
	{
		m_encrypt = true;
		rc4_init(reinterpret_cast<unsigned char const*>(key.data())
			, std::size_t(key.size()), &m_rc4_outgoing);
		// Discard first 1024 bytes
		char buf[1024];
		span<char> vec(buf, sizeof(buf));
		encrypt(vec);
	}